

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JunitReporter::testGroupStarting(JunitReporter *this,GroupInfo *groupInfo)

{
  GroupInfo *groupInfo_local;
  JunitReporter *this_local;
  
  Timer::start(&this->suiteTimer);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            (&this->stdOutForSuite);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            (&this->stdErrForSuite);
  this->unexpectedExceptions = 0;
  CumulativeReporterBase::testGroupStarting(&this->super_CumulativeReporterBase,groupInfo);
  return;
}

Assistant:

void JunitReporter::testGroupStarting(GroupInfo const &groupInfo) {
        suiteTimer.start();
        stdOutForSuite.clear();
        stdErrForSuite.clear();
        unexpectedExceptions = 0;
        CumulativeReporterBase::testGroupStarting(groupInfo);
    }